

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O1

void __thiscall cppnet::BufferBlock::~BufferBlock(BufferBlock *this)

{
  _Atomic_word *p_Var1;
  int iVar2;
  element_type *peVar3;
  int iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  bool bVar6;
  void *m;
  
  (this->super_InnerBuffer).super_Buffer._vptr_Buffer = (_func_int **)&PTR__BufferBlock_00125b48;
  (this->super_ListSlot<cppnet::BufferBlock>)._vptr_ListSlot =
       (_func_int **)&PTR__BufferBlock_00125bd8;
  if (this->_buffer_start != (char *)0x0) {
    p_Var5 = (this->_alloter).super___weak_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar4 = p_Var5->_M_use_count;
      do {
        if (iVar4 == 0) {
          p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          break;
        }
        LOCK();
        iVar2 = p_Var5->_M_use_count;
        bVar6 = iVar4 == iVar2;
        if (bVar6) {
          p_Var5->_M_use_count = iVar4 + 1;
          iVar2 = iVar4;
        }
        iVar4 = iVar2;
        UNLOCK();
      } while (!bVar6);
    }
    if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar6 = true;
    }
    else {
      bVar6 = p_Var5->_M_use_count == 0;
    }
    peVar3 = (this->_alloter).super___weak_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar3 != (element_type *)0x0 && !bVar6) {
      (*peVar3->_vptr_BlockMemoryPool[3])();
    }
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
  }
  p_Var5 = (this->_alloter).super___weak_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var5->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = p_Var5->_M_weak_count;
      p_Var5->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*p_Var5->_vptr__Sp_counted_base[3])();
    }
  }
  ListSlot<cppnet::BufferBlock>::~ListSlot(&this->super_ListSlot<cppnet::BufferBlock>);
  return;
}

Assistant:

BufferBlock::~BufferBlock() {
    if (_buffer_start) {
        auto alloter = _alloter.lock();
        if (alloter) {
            void* m = (void*)_buffer_start;
            alloter->PoolLargeFree(m);
        }
    }
}